

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

int __thiscall node::backspace(node *this,int line,int index)

{
  pointer pbVar1;
  ulong uVar2;
  pointer pbVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index < 1) {
    iVar4 = 0;
    if ((0 < line) && (index == 0)) {
      pbVar3 = (this->inputCode).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar3[(uint)line]._M_string_length + pbVar3[(ulong)(uint)line - 1]._M_string_length <
          0x12) {
        std::__cxx11::string::append((string *)(pbVar3 + ((ulong)(uint)line - 1)));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&this->inputCode,
                (this->inputCode).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (uint)line);
        iVar4 = 2;
      }
    }
  }
  else {
    pbVar1 = (this->inputCode).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = pbVar1 + line;
    uVar2 = pbVar1[line]._M_string_length;
    if ((uint)index < uVar2) {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)pbVar3);
      std::__cxx11::string::substr
                ((ulong)&local_80,
                 (ulong)((this->inputCode).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + line));
      std::operator+(&local_40,&local_60,&local_80);
      std::__cxx11::string::operator=
                ((string *)
                 ((this->inputCode).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + line),(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      iVar4 = 1;
    }
    else {
      iVar4 = 1;
      if (uVar2 == (uint)index) {
        std::__cxx11::string::substr((ulong)&local_40,(ulong)pbVar3);
        std::__cxx11::string::operator=
                  ((string *)
                   ((this->inputCode).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + line),(string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
  }
  return iVar4;
}

Assistant:

int node::backspace(int line, int index) {
  if (index > 0) {
    if (inputCode[line].length() > index) {
      inputCode[line] = inputCode[line].substr(0, index - 1) + inputCode[line].substr(index);
    } else if (inputCode[line].length() == index) {
      inputCode[line] = inputCode[line].substr(0, index - 1);
    }
    return 1;
  } else if(line > 0 && inputCode[line - 1].length() + inputCode[line].length() <= MAX_LINE_LENGTH && index == 0) {
    inputCode[line - 1] += inputCode[line];
    inputCode.erase(inputCode.begin() + line);
    return 2;
  }
  
  return 0;
}